

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiInApi::ignoreTypes(MidiInApi *this,bool midiSysex,bool midiTime,bool midiSense)

{
  uchar uVar1;
  undefined3 in_register_00000009;
  uchar uVar2;
  undefined7 in_register_00000011;
  
  uVar1 = midiSysex + '\x02';
  if ((int)CONCAT71(in_register_00000011,midiTime) == 0) {
    uVar1 = midiSysex;
  }
  uVar2 = uVar1 + '\x04';
  if (CONCAT31(in_register_00000009,midiSense) == 0) {
    uVar2 = uVar1;
  }
  (this->inputData_).ignoreFlags = uVar2;
  return;
}

Assistant:

void MidiInApi :: ignoreTypes( bool midiSysex, bool midiTime, bool midiSense )
{
  inputData_.ignoreFlags = 0;
  if ( midiSysex ) inputData_.ignoreFlags = 0x01;
  if ( midiTime ) inputData_.ignoreFlags |= 0x02;
  if ( midiSense ) inputData_.ignoreFlags |= 0x04;
}